

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale,bool shadow)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  ImGuiContext *g;
  undefined7 in_register_00000039;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  fVar7 = pIVar3->FontSize * 0.4 * scale;
  fVar8 = pIVar3->FontSize * 0.5;
  fVar9 = fVar8 + p_min.x;
  fVar8 = scale * fVar8 + p_min.y;
  if ((int)CONCAT71(in_register_00000039,is_open) == 0) {
    fVar10 = fVar7 * 0.0 + fVar8;
    fVar5 = fVar7 * -0.5 + fVar9;
    fVar6 = fVar8 + fVar7 * 0.866;
    fVar8 = fVar8 - fVar7 * 0.866;
    fVar11 = fVar5;
  }
  else {
    fVar8 = fVar7 * -0.25 + fVar8;
    fVar10 = fVar7 + fVar8;
    fVar5 = fVar9 - fVar7 * 0.866;
    fVar6 = fVar8 - fVar7 * 0.5;
    fVar11 = fVar7 * 0.866 + fVar9;
    fVar8 = fVar6;
    fVar7 = fVar7 * 0.0;
  }
  local_48.y = fVar10;
  local_48.x = fVar7 + fVar9;
  local_50.y = fVar6;
  local_50.x = fVar5;
  local_58.y = fVar8;
  local_58.x = fVar11;
  if ((shadow) && ((pIVar1->Flags & 0x80) != 0)) {
    pIVar2 = pIVar1->DrawList;
    local_30.y = fVar10 + 2.0;
    local_30.x = fVar7 + fVar9 + 2.0;
    local_38.y = fVar6 + 2.0;
    local_38.x = fVar5 + 2.0;
    local_40.y = fVar8 + 2.0;
    local_40.x = fVar11 + 2.0;
    IVar4 = GetColorU32(6,1.0);
    ImDrawList::AddTriangleFilled(pIVar2,&local_30,&local_38,&local_40,IVar4);
  }
  pIVar2 = pIVar1->DrawList;
  IVar4 = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(pIVar2,&local_48,&local_50,&local_58,IVar4);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale, bool shadow)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    if (shadow && (window->Flags & ImGuiWindowFlags_ShowBorders) != 0)
        window->DrawList->AddTriangleFilled(a+ImVec2(2,2), b+ImVec2(2,2), c+ImVec2(2,2), GetColorU32(ImGuiCol_BorderShadow));
    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}